

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::resize(QWidget *this,QSize *s)

{
  QWidgetPrivate *this_00;
  QWidgetData *pQVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  setAttribute(this,WA_Resized,true);
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) == 0) {
    pQVar1 = this->data;
    local_38.x1.m_i = (pQVar1->crect).x1.m_i;
    local_38.y1.m_i = (pQVar1->crect).y1.m_i;
    local_38.x2.m_i = (pQVar1->crect).x2.m_i;
    local_38.y2.m_i = (pQVar1->crect).y2.m_i;
    lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
    if (lVar2 == 0) {
      uVar7 = 0xffffff00ffffff;
    }
    else {
      uVar7 = *(undefined8 *)(lVar2 + 0x68);
    }
    iVar4 = (s->wd).m_i;
    iVar6 = (s->ht).m_i;
    if ((int)uVar7 <= iVar4) {
      iVar4 = (int)uVar7;
    }
    iVar5 = (int)((ulong)uVar7 >> 0x20);
    if (iVar6 < iVar5) {
      iVar5 = iVar6;
    }
    if (lVar2 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined8 *)(lVar2 + 0x60);
    }
    if (iVar4 <= (int)uVar7) {
      iVar4 = (int)uVar7;
    }
    iVar6 = (int)((ulong)uVar7 >> 0x20);
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    (pQVar1->crect).x2.m_i = iVar4 + (pQVar1->crect).x1.m_i + -1;
    (pQVar1->crect).y2.m_i = iVar6 + (pQVar1->crect).y1.m_i + -1;
    bVar3 = ::operator!=(&local_38,&this->data->crect);
    if (bVar3) {
      setAttribute(this,WA_PendingResizeEvent,true);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    QWidgetPrivate::fixPosIncludesFrame(this_00);
    QWidgetPrivate::setGeometry_sys
              (this_00,(this->data->crect).x1.m_i,(this->data->crect).y1.m_i,(s->wd).m_i,(s->ht).m_i
               ,false);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QWidgetPrivate::setDirtyOpaqueRegion(this_00);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::resize(const QSize &s)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Resized);
    if (testAttribute(Qt::WA_WState_Created)) {
        d->fixPosIncludesFrame();
        d->setGeometry_sys(geometry().x(), geometry().y(), s.width(), s.height(), false);
        d->setDirtyOpaqueRegion();
    } else {
        const auto oldRect = data->crect;
        data->crect.setSize(s.boundedTo(maximumSize()).expandedTo(minimumSize()));
        if (oldRect != data->crect)
            setAttribute(Qt::WA_PendingResizeEvent);
    }
}